

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btCollisionWorld.cpp
# Opt level: O3

bool __thiscall
btSingleContactCallback::process(btSingleContactCallback *this,btBroadphaseProxy *proxy)

{
  btCollisionObject *pbVar1;
  ContactResultCallback *pCVar2;
  btDispatcher *pbVar3;
  char cVar4;
  int iVar5;
  undefined4 extraout_var;
  btCollisionObjectWrapper ob1;
  btCollisionObjectWrapper ob0;
  btBridgedManifoldResult contactPointResult;
  btCollisionObjectWrapper local_b8;
  btCollisionObjectWrapper local_90;
  btManifoldResult local_68;
  ContactResultCallback *local_38;
  long *plVar6;
  
  pbVar1 = (btCollisionObject *)proxy->m_clientObject;
  if (pbVar1 != this->m_collisionObject) {
    cVar4 = (**(code **)(*(long *)this->m_resultCallback + 0x10))
                      (this->m_resultCallback,pbVar1->m_broadphaseHandle);
    if (cVar4 != '\0') {
      local_90.m_collisionObject = this->m_collisionObject;
      local_90.m_shape = (local_90.m_collisionObject)->m_collisionShape;
      local_90.m_parent = (btCollisionObjectWrapper *)0x0;
      local_90.m_worldTransform = &(local_90.m_collisionObject)->m_worldTransform;
      local_90.m_partId = -1;
      local_90.m_index = -1;
      local_b8.m_shape = pbVar1->m_collisionShape;
      local_b8.m_parent = (btCollisionObjectWrapper *)0x0;
      local_b8.m_worldTransform = &pbVar1->m_worldTransform;
      local_b8.m_partId = -1;
      local_b8.m_index = -1;
      local_b8.m_collisionObject = pbVar1;
      iVar5 = (*this->m_world->m_dispatcher1->_vptr_btDispatcher[2])();
      plVar6 = (long *)CONCAT44(extraout_var,iVar5);
      if (plVar6 != (long *)0x0) {
        pCVar2 = this->m_resultCallback;
        btManifoldResult::btManifoldResult(&local_68,&local_90,&local_b8);
        local_68.super_Result._vptr_Result = (_func_int **)&PTR__Result_0021bdc8;
        local_38 = pCVar2;
        (**(code **)(*plVar6 + 0x10))
                  (plVar6,&local_90,&local_b8,&this->m_world->m_dispatchInfo,&local_68);
        (**(code **)*plVar6)(plVar6);
        pbVar3 = this->m_world->m_dispatcher1;
        (*pbVar3->_vptr_btDispatcher[0xf])(pbVar3,plVar6);
      }
    }
  }
  return true;
}

Assistant:

virtual bool	process(const btBroadphaseProxy* proxy)
	{
		btCollisionObject*	collisionObject = (btCollisionObject*)proxy->m_clientObject;
		if (collisionObject == m_collisionObject)
			return true;

		//only perform raycast if filterMask matches
		if(m_resultCallback.needsCollision(collisionObject->getBroadphaseHandle())) 
		{
			btCollisionObjectWrapper ob0(0,m_collisionObject->getCollisionShape(),m_collisionObject,m_collisionObject->getWorldTransform(),-1,-1);
			btCollisionObjectWrapper ob1(0,collisionObject->getCollisionShape(),collisionObject,collisionObject->getWorldTransform(),-1,-1);

			btCollisionAlgorithm* algorithm = m_world->getDispatcher()->findAlgorithm(&ob0,&ob1);
			if (algorithm)
			{
				btBridgedManifoldResult contactPointResult(&ob0,&ob1, m_resultCallback);
				//discrete collision detection query
				
				algorithm->processCollision(&ob0,&ob1, m_world->getDispatchInfo(),&contactPointResult);

				algorithm->~btCollisionAlgorithm();
				m_world->getDispatcher()->freeCollisionAlgorithm(algorithm);
			}
		}
		return true;
	}